

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ErrorHandling.cpp
# Opt level: O3

void llvm::report_fatal_error(Twine *Reason,bool GenCrashDiag)

{
  fatal_error_handler_t p_Var1;
  void *pvVar2;
  int iVar3;
  raw_ostream *OS_00;
  StringRef Str;
  StringRef Str_00;
  SmallVector<char,_64U> Buffer;
  raw_svector_ostream OS;
  string local_b0 [2];
  raw_ostream local_60;
  string *local_38;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&ErrorHandlerMutex);
  pvVar2 = ErrorHandlerUserData;
  p_Var1 = ErrorHandler_abi_cxx11_;
  if (iVar3 == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&ErrorHandlerMutex);
    if (p_Var1 == (fatal_error_handler_t)0x0) {
      local_b0[0]._M_string_length = 0x4000000000;
      local_60.BufferMode = InternalBuffer;
      local_60.OutBufStart = (char *)0x0;
      local_60.OutBufEnd = (char *)0x0;
      local_60.OutBufCur = (char *)0x0;
      local_60._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_00251be0;
      local_38 = local_b0;
      local_b0[0]._M_dataplus._M_p = (pointer)&local_b0[0].field_2;
      raw_ostream::SetUnbuffered(&local_60);
      Str.Length = 0xc;
      Str.Data = "LLVM ERROR: ";
      OS_00 = raw_ostream::operator<<(&local_60,Str);
      Twine::print(Reason,OS_00);
      Str_00.Length = 1;
      Str_00.Data = "\n";
      raw_ostream::operator<<(OS_00,Str_00);
      write(2,(local_38->_M_dataplus)._M_p,(ulong)(uint)local_38->_M_string_length);
      raw_ostream::~raw_ostream(&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0[0]._M_dataplus._M_p != &local_b0[0].field_2) {
        free(local_b0[0]._M_dataplus._M_p);
      }
    }
    else {
      Twine::str_abi_cxx11_(local_b0,Reason);
      (*p_Var1)(pvVar2,local_b0,GenCrashDiag);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0[0]._M_dataplus._M_p != &local_b0[0].field_2) {
        operator_delete(local_b0[0]._M_dataplus._M_p,local_b0[0].field_2._M_allocated_capacity + 1);
      }
    }
    sys::RunInterruptHandlers();
    exit(1);
  }
  std::__throw_system_error(iVar3);
}

Assistant:

void llvm::report_fatal_error(const Twine &Reason, bool GenCrashDiag) {
  llvm::fatal_error_handler_t handler = nullptr;
  void* handlerData = nullptr;
  {
    // Only acquire the mutex while reading the handler, so as not to invoke a
    // user-supplied callback under a lock.
#if LLVM_ENABLE_THREADS == 1
    std::lock_guard<std::mutex> Lock(ErrorHandlerMutex);
#endif
    handler = ErrorHandler;
    handlerData = ErrorHandlerUserData;
  }

  if (handler) {
    handler(handlerData, Reason.str(), GenCrashDiag);
  } else {
    // Blast the result out to stderr.  We don't try hard to make sure this
    // succeeds (e.g. handling EINTR) and we can't use errs() here because
    // raw ostreams can call report_fatal_error.
    SmallVector<char, 64> Buffer;
    raw_svector_ostream OS(Buffer);
    OS << "LLVM ERROR: " << Reason << "\n";
    StringRef MessageStr = OS.str();
    ssize_t written = ::write(2, MessageStr.data(), MessageStr.size());
    (void)written; // If something went wrong, we deliberately just give up.
  }

  // If we reached here, we are failing ungracefully. Run the interrupt handlers
  // to make sure any special cleanups get done, in particular that we remove
  // files registered with RemoveFileOnSignal.
  sys::RunInterruptHandlers();

  exit(1);
}